

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O3

RPCHelpMan * wallet::listlabels(void)

{
  ulong *puVar1;
  string name;
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_02;
  RPCArgOptions opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  RPCHelpMan *in_RDI;
  undefined8 uVar5;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff8d8;
  undefined8 in_stack_fffffffffffff8e8;
  undefined8 in_stack_fffffffffffff8f0;
  undefined8 in_stack_fffffffffffff8f8;
  code *pcVar6;
  undefined8 in_stack_fffffffffffff900;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff908;
  pointer in_stack_fffffffffffff918;
  pointer pRVar7;
  pointer in_stack_fffffffffffff920;
  pointer pRVar8;
  pointer in_stack_fffffffffffff928;
  pointer pRVar9;
  _Vector_impl_data in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff948 [16];
  pointer in_stack_fffffffffffff958;
  pointer in_stack_fffffffffffff960;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff978 [16];
  _Alloc_hider in_stack_fffffffffffff988;
  _Alloc_hider _Var10;
  size_type in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined8 in_stack_fffffffffffff9a0;
  _Alloc_hider in_stack_fffffffffffff9a8;
  _Alloc_hider _Var11;
  size_type in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ulong *local_438;
  undefined8 local_430;
  ulong local_428;
  undefined8 uStack_420;
  ulong *local_418;
  size_type local_410;
  ulong local_408;
  undefined8 uStack_400;
  long *local_3f8 [2];
  long local_3e8 [2];
  long *local_3d8 [2];
  long local_3c8 [2];
  RPCResult local_3b8;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  RPCResult local_2f0;
  undefined1 local_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  undefined1 local_240 [32];
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"listlabels","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nReturns the list of all labels, or labels that are assigned to addresses with a specific purpose.\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"purpose","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,
             "Address purpose to list labels for (\'send\',\'receive\'). An empty string is the same as not providing this argument."
             ,"");
  local_268 = 0;
  local_258 = 0;
  local_250 = 0;
  local_240._0_8_ = (pointer)0x0;
  local_240._8_2_ = 0;
  local_240._10_6_ = 0;
  local_240._16_2_ = 0;
  local_240._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff8e8;
  name.field_2._8_8_ = in_stack_fffffffffffff8f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff900;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff8f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff908;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff918;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff920;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff928;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff930._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff930._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff930._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff948;
  description_02._M_string_length = (size_type)in_stack_fffffffffffff960;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff958;
  description_02.field_2 = in_stack_fffffffffffff968;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff988._M_p;
  opts.skip_type_check = (bool)in_stack_fffffffffffff978[0];
  opts._1_7_ = in_stack_fffffffffffff978._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff978._8_8_;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff990;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff998;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff9a0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff9a8._M_p;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff9b0;
  opts.hidden = (bool)(char)in_stack_fffffffffffff9b8;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffff9b8 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffff9b8 >> 0x10);
  local_260 = &local_250;
  ::RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_02,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff970,__l,
             (allocator_type *)&stack0xfffffffffffff96f);
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"");
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"label","");
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Label name","");
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8e8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8f0;
  description._M_string_length = in_stack_fffffffffffff900;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  description.field_2 = in_stack_fffffffffffff908;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ::RPCResult::RPCResult(&local_3b8,STR,m_key_name,description,inner,SUB81(local_3d8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_3b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff938,__l_00,
             (allocator_type *)&stack0xfffffffffffff917);
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8d8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8e8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8f0;
  description_00._M_string_length = in_stack_fffffffffffff900;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8f8;
  description_00.field_2 = in_stack_fffffffffffff908;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  ::RPCResult::RPCResult(&local_2f0,ARR,m_key_name_00,description_00,inner_00,SUB81(local_310,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result._0_8_ = in_stack_fffffffffffff8d8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8e8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8f0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8f8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff900;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff908;
  result._64_8_ = pRVar7;
  result.m_description._M_dataplus._M_p = (pointer)pRVar8;
  result.m_description._M_string_length = (size_type)pRVar9;
  result._88_24_ = in_stack_fffffffffffff930;
  result.m_cond._8_16_ = in_stack_fffffffffffff948;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff958;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff950,result);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"listlabels","");
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"");
  HelpExampleCli(&local_518,&local_538,&local_558);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_518,0,0,"\nList all labels\n",0x11);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if (paVar4 == paVar3) {
    local_4f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_4f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
  }
  else {
    local_4f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_4f8._M_dataplus._M_p = (pointer)paVar4;
  }
  local_4f8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_4f8,"\nList labels that have receiving addresses\n");
  local_4d8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p == paVar4) {
    local_4d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_4d8.field_2._8_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    local_4d8.field_2._12_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  }
  else {
    local_4d8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_4d8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"listlabels","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"receive","");
  HelpExampleCli(&local_578,&local_598,&local_5b8);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    uVar5 = local_4d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_578._M_string_length + local_4d8._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      uVar5 = local_578.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_578._M_string_length + local_4d8._M_string_length) goto LAB_00260805;
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_578,0,0,local_4d8._M_dataplus._M_p,local_4d8._M_string_length);
  }
  else {
LAB_00260805:
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_4d8,local_578._M_dataplus._M_p,local_578._M_string_length);
  }
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if (paVar3 == paVar4) {
    local_4b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_4b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
  }
  else {
    local_4b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_4b8._M_dataplus._M_p = (pointer)paVar3;
  }
  local_4b8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_4b8,"\nList labels that have sending addresses\n");
  local_498._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p == paVar4) {
    local_498.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_498.field_2._8_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    local_498.field_2._12_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  }
  else {
    local_498.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_498._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"listlabels","");
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"send","");
  HelpExampleCli(&local_5d8,&local_5f8,&local_618);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    uVar5 = local_498.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_5d8._M_string_length + local_498._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      uVar5 = local_5d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar5 < local_5d8._M_string_length + local_498._M_string_length) goto LAB_002609a2;
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_5d8,0,0,local_498._M_dataplus._M_p,local_498._M_string_length);
  }
  else {
LAB_002609a2:
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_498,local_5d8._M_dataplus._M_p,local_5d8._M_string_length);
  }
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if (paVar3 == paVar4) {
    local_478.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_478.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
  }
  else {
    local_478.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_478._M_dataplus._M_p = (pointer)paVar3;
  }
  local_478._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  paVar4->_M_local_buf[0] = '\0';
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_478,"\nAs a JSON-RPC call\n");
  paVar4 = &local_458.field_2;
  local_458._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p == paVar3) {
    local_458.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_458.field_2._8_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    local_458.field_2._12_4_ = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_458._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_458.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_458._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  _Var11._M_p = &stack0xfffffffffffff9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff9a8,"listlabels","");
  _Var10._M_p = &stack0xfffffffffffff998;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffff988,"receive","");
  HelpExampleRpc(&local_638,(string *)&stack0xfffffffffffff9a8,(string *)&stack0xfffffffffffff988);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != paVar4) {
    uVar5 = local_458.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_638._M_string_length + local_458._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_dataplus._M_p != &local_638.field_2) {
      uVar5 = local_638.field_2._M_allocated_capacity;
    }
    if (local_638._M_string_length + local_458._M_string_length <= (ulong)uVar5) {
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_638,0,0,local_458._M_dataplus._M_p,local_458._M_string_length);
      goto LAB_00260b62;
    }
  }
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_458,local_638._M_dataplus._M_p,local_638._M_string_length);
LAB_00260b62:
  local_438 = &local_428;
  puVar1 = (ulong *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == paVar3) {
    local_428 = paVar3->_M_allocated_capacity;
    uStack_420 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
  }
  else {
    local_428 = paVar3->_M_allocated_capacity;
    local_438 = puVar1;
  }
  local_410 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  paVar3->_M_local_buf[0] = '\0';
  if (local_438 == &local_428) {
    uStack_400 = uStack_420;
    local_418 = &local_408;
  }
  else {
    local_418 = local_438;
  }
  local_408 = local_428;
  local_430 = 0;
  local_428 = local_428 & 0xffffffffffffff00;
  pcVar6 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:749:9)>
           ::_M_manager;
  description_01._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:749:9)>
       ::_M_invoke;
  description_01._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/addresses.cpp:749:9)>
                ::_M_manager;
  description_01.field_2 = in_stack_fffffffffffff908;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar9;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff958;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff948._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff948._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff960;
  local_438 = &local_428;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff8e8)),description_01,args,
             (RPCResults)in_stack_fffffffffffff930,examples,(RPCMethodImpl *)&local_58);
  if (pcVar6 != (code *)0x0) {
    (*pcVar6)(&stack0xfffffffffffff8e8,&stack0xfffffffffffff8e8,3);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,local_408 + 1);
  }
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if (_Var10._M_p != &stack0xfffffffffffff998) {
    operator_delete(_Var10._M_p,in_stack_fffffffffffff998 + 1);
  }
  if (_Var11._M_p != &stack0xfffffffffffff9b8) {
    operator_delete(_Var11._M_p,in_stack_fffffffffffff9b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != paVar4) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_cond._M_dataplus._M_p != &local_2f0.m_cond.field_2) {
    operator_delete(local_2f0.m_cond._M_dataplus._M_p,
                    local_2f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_description._M_dataplus._M_p != &local_2f0.m_description.field_2) {
    operator_delete(local_2f0.m_description._M_dataplus._M_p,
                    local_2f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_key_name._M_dataplus._M_p != &local_2f0.m_key_name.field_2) {
    operator_delete(local_2f0.m_key_name._M_dataplus._M_p,
                    local_2f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff938);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_cond._M_dataplus._M_p != &local_3b8.m_cond.field_2) {
    operator_delete(local_3b8.m_cond._M_dataplus._M_p,
                    local_3b8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_description._M_dataplus._M_p != &local_3b8.m_description.field_2) {
    operator_delete(local_3b8.m_description._M_dataplus._M_p,
                    local_3b8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3b8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_key_name._M_dataplus._M_p != &local_3b8.m_key_name.field_2) {
    operator_delete(local_3b8.m_key_name._M_dataplus._M_p,
                    local_3b8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff970);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_240);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listlabels()
{
    return RPCHelpMan{"listlabels",
                "\nReturns the list of all labels, or labels that are assigned to addresses with a specific purpose.\n",
                {
                    {"purpose", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Address purpose to list labels for ('send','receive'). An empty string is the same as not providing this argument."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::STR, "label", "Label name"},
                    }
                },
                RPCExamples{
            "\nList all labels\n"
            + HelpExampleCli("listlabels", "") +
            "\nList labels that have receiving addresses\n"
            + HelpExampleCli("listlabels", "receive") +
            "\nList labels that have sending addresses\n"
            + HelpExampleCli("listlabels", "send") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listlabels", "receive")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::optional<AddressPurpose> purpose;
    if (!request.params[0].isNull()) {
        std::string purpose_str = request.params[0].get_str();
        if (!purpose_str.empty()) {
            purpose = PurposeFromString(purpose_str);
            if (!purpose) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid 'purpose' argument, must be a known purpose string, typically 'send', or 'receive'.");
            }
        }
    }

    // Add to a set to sort by label name, then insert into Univalue array
    std::set<std::string> label_set = pwallet->ListAddrBookLabels(purpose);

    UniValue ret(UniValue::VARR);
    for (const std::string& name : label_set) {
        ret.push_back(name);
    }

    return ret;
},
    };
}